

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O2

int ov_crosslap(OggVorbis_File *vf1,OggVorbis_File *vf2)

{
  int ch2;
  vorbis_dsp_state *vd;
  int lapsize;
  int iVar1;
  vorbis_info *pvVar2;
  long lVar3;
  float **ppfVar4;
  int n2;
  long lVar5;
  float **lappcm;
  float *apfStack_80 [2];
  float **local_70;
  float **pcm;
  float *local_60;
  vorbis_dsp_state *local_58;
  vorbis_info *local_50;
  vorbis_info *local_48;
  int local_3c;
  int local_38;
  int local_34;
  
  if (vf1 != vf2) {
    iVar1 = -0x83;
    if ((1 < vf1->ready_state) && (1 < vf2->ready_state)) {
      apfStack_80[0] = (float *)0x19184e;
      iVar1 = _ov_initset(vf1);
      if (iVar1 == 0) {
        apfStack_80[0] = (float *)0x19185e;
        iVar1 = _ov_initprime(vf2);
        if (iVar1 == 0) {
          apfStack_80[0] = (float *)0x191875;
          pvVar2 = ov_info(vf1,-1);
          apfStack_80[0] = (float *)0x191883;
          local_48 = ov_info(vf2,-1);
          apfStack_80[0] = (float *)0x19188f;
          local_34 = ov_halfrate_p(vf1);
          apfStack_80[0] = (float *)0x19189a;
          iVar1 = ov_halfrate_p(vf2);
          lVar3 = -((long)pvVar2->channels * 8 + 0xfU & 0xfffffffffffffff0);
          lappcm = (float **)((long)apfStack_80 + lVar3 + 8);
          local_50 = pvVar2;
          *(undefined8 *)((long)apfStack_80 + lVar3) = 0x1918c7;
          local_38 = vorbis_info_blocksize(pvVar2,0);
          pvVar2 = local_48;
          local_38 = local_38 >> ((char)local_34 + 1U & 0x1f);
          *(undefined8 *)((long)apfStack_80 + lVar3) = 0x1918dc;
          local_3c = vorbis_info_blocksize(pvVar2,0);
          local_34 = iVar1 + 1;
          local_58 = &vf1->vd;
          *(undefined8 *)((long)apfStack_80 + lVar3) = 0x1918fb;
          pcm = (float **)vorbis_window(&vf1->vd,0);
          pvVar2 = local_50;
          *(undefined8 *)((long)apfStack_80 + lVar3) = 0x191910;
          local_60 = vorbis_window(&vf2->vd,0);
          lapsize = local_38;
          iVar1 = pvVar2->channels;
          lVar3 = (long)local_38;
          ppfVar4 = lappcm;
          for (lVar5 = 0; vd = local_58, lVar5 < iVar1; lVar5 = lVar5 + 1) {
            ppfVar4 = (float **)((long)ppfVar4 - (lVar3 * 4 + 0xfU & 0xfffffffffffffff0));
            lappcm[lVar5] = (float *)ppfVar4;
          }
          n2 = local_3c >> ((byte)local_34 & 0x1f);
          ppfVar4[-1] = (float *)0x19196a;
          _ov_getlap(vf1,pvVar2,vd,lappcm,lapsize);
          ppfVar4[-1] = (float *)0x191979;
          vorbis_synthesis_lapout(&vf2->vd,&local_70);
          iVar1 = pvVar2->channels;
          ch2 = local_48->channels;
          ppfVar4[-1] = local_60;
          ppfVar4[-2] = (float *)pcm;
          ppfVar4[-3] = (float *)0x19199c;
          _ov_splice(local_70,lappcm,lapsize,n2,iVar1,ch2,ppfVar4[-2],ppfVar4[-1]);
          iVar1 = 0;
        }
      }
    }
    return iVar1;
  }
  return 0;
}

Assistant:

int ov_crosslap(OggVorbis_File *vf1, OggVorbis_File *vf2){
  vorbis_info *vi1,*vi2;
  float **lappcm;
  float **pcm;
  const float *w1,*w2;
  int n1,n2,i,ret,hs1,hs2;

  if(vf1==vf2)return(0); /* degenerate case */
  if(vf1->ready_state<OPENED)return(OV_EINVAL);
  if(vf2->ready_state<OPENED)return(OV_EINVAL);

  /* the relevant overlap buffers must be pre-checked and pre-primed
     before looking at settings in the event that priming would cross
     a bitstream boundary.  So, do it now */

  ret=_ov_initset(vf1);
  if(ret)return(ret);
  ret=_ov_initprime(vf2);
  if(ret)return(ret);

  vi1=ov_info(vf1,-1);
  vi2=ov_info(vf2,-1);
  hs1=ov_halfrate_p(vf1);
  hs2=ov_halfrate_p(vf2);

  lappcm=alloca(sizeof(*lappcm)*vi1->channels);
  n1=vorbis_info_blocksize(vi1,0)>>(1+hs1);
  n2=vorbis_info_blocksize(vi2,0)>>(1+hs2);
  w1=vorbis_window(&vf1->vd,0);
  w2=vorbis_window(&vf2->vd,0);

  for(i=0;i<vi1->channels;i++)
    lappcm[i]=alloca(sizeof(**lappcm)*n1);

  _ov_getlap(vf1,vi1,&vf1->vd,lappcm,n1);

  /* have a lapping buffer from vf1; now to splice it into the lapping
     buffer of vf2 */
  /* consolidate and expose the buffer. */
  vorbis_synthesis_lapout(&vf2->vd,&pcm);

#if 0
  _analysis_output_always("pcmL",0,pcm[0],n1*2,0,0,0);
  _analysis_output_always("pcmR",0,pcm[1],n1*2,0,0,0);
#endif

  /* splice */
  _ov_splice(pcm,lappcm,n1,n2,vi1->channels,vi2->channels,w1,w2);

  /* done */
  return(0);
}